

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_varname(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *cclass;
  char *extraout_RDX_02;
  char *pcVar5;
  char *extraout_RDX_03;
  int iVar6;
  
  iVar4 = G->pos;
  iVar1 = G->thunkpos;
  iVar2 = yymatchClass(G,(uchar *)"",in_RDX);
  pcVar5 = extraout_RDX;
  if (iVar2 == 0) {
    G->pos = iVar4;
    G->thunkpos = iVar1;
    iVar4 = 0;
  }
  else {
    do {
      iVar4 = G->pos;
      iVar1 = G->thunkpos;
      iVar2 = yymatchClass(G,(uchar *)"",pcVar5);
      pcVar5 = extraout_RDX_00;
      if (iVar2 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar1;
        iVar2 = yymatchChar(G,0x2d);
        iVar3 = 8;
        pcVar5 = cclass;
        if ((iVar2 != 0) &&
           (iVar2 = yymatchClass(G,(uchar *)"",cclass), pcVar5 = extraout_RDX_02, iVar2 != 0)) {
          do {
            iVar2 = G->pos;
            iVar6 = G->thunkpos;
            iVar3 = yymatchClass(G,(uchar *)"",pcVar5);
            pcVar5 = extraout_RDX_03;
          } while (iVar3 != 0);
          iVar3 = 0;
          goto LAB_0010a137;
        }
      }
      else {
        do {
          iVar2 = G->pos;
          iVar6 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",pcVar5);
          pcVar5 = extraout_RDX_01;
        } while (iVar3 != 0);
        iVar3 = 7;
LAB_0010a137:
        G->pos = iVar2;
        G->thunkpos = iVar6;
      }
      if (iVar3 == 0) {
LAB_0010a14f:
        iVar3 = 3;
      }
      else if (iVar3 == 8) {
        G->pos = iVar4;
        G->thunkpos = iVar1;
        iVar3 = 0;
      }
      else if (iVar3 == 7) goto LAB_0010a14f;
    } while (iVar3 != 0);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

YY_RULE(int) yy_varname(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "varname"));
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z_")) goto l197;

  l198:;	
  {  int yypos199= G->pos, yythunkpos199= G->thunkpos;
  {  int yypos200= G->pos, yythunkpos200= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l201;

  l202:;	
  {  int yypos203= G->pos, yythunkpos203= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l203;
  goto l202;
  l203:;	  G->pos= yypos203; G->thunkpos= yythunkpos203;
  }  goto l200;
  l201:;	  G->pos= yypos200; G->thunkpos= yythunkpos200;  if (!yymatchChar(G, '-')) goto l199;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z_")) goto l199;

  l204:;	
  {  int yypos205= G->pos, yythunkpos205= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l205;
  goto l204;
  l205:;	  G->pos= yypos205; G->thunkpos= yythunkpos205;
  }
  }
  l200:;	  goto l198;
  l199:;	  G->pos= yypos199; G->thunkpos= yythunkpos199;
  }  yyprintf((stderr, "  ok   varname"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l197:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "varname"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}